

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O2

Data * __thiscall ON_EmbeddedFile::CImpl::Data::operator=(Data *this,Data *d)

{
  _Head_base<0UL,_unsigned_char_*,_false> __dest;
  
  if (this != d) {
    SetLength(this,d->m_length);
    this->m_compressed_length = d->m_compressed_length;
    __dest._M_head_impl =
         (this->m_buffer)._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    if (__dest._M_head_impl == (uchar *)0x0) {
      this->m_length = 0;
      this->m_compressed_length = 0;
    }
    else {
      memcpy(__dest._M_head_impl,
             (d->m_buffer)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,this->m_length);
    }
    this->m_error = d->m_error;
  }
  return this;
}

Assistant:

const ON_EmbeddedFile::CImpl::Data& ON_EmbeddedFile::CImpl::Data::operator = (const Data& d)
{
  if (this == &d)
    return *this;

  SetLength(d.m_length);

  m_compressed_length = d.m_compressed_length;

  if (m_buffer)
  {
    memcpy(m_buffer.get(), d.m_buffer.get(), m_length);
  }
  else
  {
    m_length = m_compressed_length = 0;
  }

  m_error = d.m_error;

  return *this;
}